

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

hugeint_t duckdb::GreatestCommonDivisor<duckdb::hugeint_t>(hugeint_t left,hugeint_t right)

{
  hugeint_t input;
  bool bVar1;
  uint64_t in_RCX;
  uint64_t in_RDX;
  hugeint_t a;
  hugeint_t b;
  hugeint_t local_a8;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  
  local_78.lower = 0;
  local_78.upper = -0x8000000000000000;
  bVar1 = hugeint_t::operator==(&local_68,&local_78);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_38,-1);
    bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff68,&local_38);
    if (!bVar1) goto LAB_01adcecd;
LAB_01adcf10:
    hugeint_t::hugeint_t(&local_28,1);
  }
  else {
LAB_01adcecd:
    hugeint_t::hugeint_t(&local_48,-1);
    bVar1 = hugeint_t::operator==(&local_68,&local_48);
    if (bVar1) {
      local_58.lower = 0;
      local_58.upper = -0x8000000000000000;
      bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff68,&local_58);
      if (bVar1) goto LAB_01adcf10;
    }
    hugeint_t::hugeint_t(&local_78,0);
    bVar1 = hugeint_t::operator==(&local_a8,&local_78);
    if (!bVar1) {
      do {
        hugeint_t::operator%=((hugeint_t *)&stack0xffffffffffffff78,&local_a8);
        hugeint_t::hugeint_t(&local_78,0);
        bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff78,&local_78);
        if (bVar1) break;
        hugeint_t::operator%=(&local_a8,(hugeint_t *)&stack0xffffffffffffff78);
        hugeint_t::hugeint_t(&local_78,0);
        bVar1 = hugeint_t::operator==(&local_a8,&local_78);
      } while (!bVar1);
    }
    input.upper = in_RDX;
    input.lower = in_RCX;
    local_28 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input);
  }
  return local_28;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}